

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

bool __thiscall
tinyusdz::Xformable::EvaluateXformOps
          (Xformable *this,double t,TimeSampleInterpolationType tinterp,matrix4d *out_matrix,
          bool *resetXformStack,string *err)

{
  pointer pXVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char cVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  value_type *pvVar11;
  value_type *pvVar12;
  value_type *pvVar13;
  value_type *q;
  value_type *pvVar14;
  XformEvaluator *pXVar15;
  value_type *pvVar16;
  value_type *pvVar17;
  value_type *q_00;
  value_type *pvVar18;
  value_type_conflict1 *pvVar19;
  value_type *q_01;
  value_type_conflict5 *pvVar20;
  uint *puVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  optional<float> oVar23;
  optional<float> oVar24;
  long lVar25;
  OpType *op;
  OpType *op_00;
  long lVar26;
  size_type *psVar27;
  char *pcVar28;
  matrix4d *pmVar29;
  size_type *psVar30;
  double *pdVar31;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *peVar32;
  undefined8 *puVar33;
  string *args_1;
  byte bVar34;
  float fVar35;
  float fVar36;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar37 [16];
  float in_XMM2 [4];
  undefined8 uVar39;
  float afVar38 [4];
  undefined1 local_3e8 [16];
  allocator local_3c9;
  undefined1 local_3c8 [16];
  optional<float> f_2;
  size_type local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  float local_398 [4];
  optional<tinyusdz::value::quatd> d_1;
  optional<tinyusdz::value::quatf> f_1;
  XformEvaluator eval;
  optional<std::array<tinyusdz::value::half,_3UL>_> h;
  undefined1 local_268 [112];
  double dStack_1f8;
  double local_1f0;
  optional<tinyusdz::value::quath> h_1;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  value_type x;
  optional<std::array<float,_3UL>_> f;
  matrix4d cm;
  
  bVar34 = 0;
  cm.m[0][0] = 1.0;
  cm.m[0][1] = 0.0;
  cm.m[0][2] = 0.0;
  cm.m[0][3] = 0.0;
  cm.m[1][0] = 0.0;
  cm.m[1][1] = 1.0;
  cm.m[1][2] = 0.0;
  cm.m[1][3] = 0.0;
  cm.m[2][0] = 0.0;
  cm.m[2][1] = 0.0;
  cm.m[2][2] = 1.0;
  cm.m[2][3] = 0.0;
  cm.m[3][0] = 0.0;
  cm.m[3][1] = 0.0;
  cm.m[3][2] = 0.0;
  cm.m[3][3] = 1.0;
  args_1 = err;
  Identity(&cm);
  uVar7 = 0;
  while( true ) {
    uVar9 = uVar7;
    pXVar1 = (this->xformOps).
             super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    oVar24.has_value_ = true;
    oVar24._1_3_ = 0;
    oVar24.contained = (storage_t<float>)0x0;
    uVar10 = ((long)(this->xformOps).
                    super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pXVar1) / 0x70;
    if (uVar10 <= uVar9) break;
    XformOp::XformOp(&x,pXVar1 + uVar9);
    local_268._0_8_ = 1.0;
    local_268._24_8_ = 0.0;
    local_268._32_8_ = 0.0;
    local_268._8_8_ = 0.0;
    local_268._16_8_ = 0.0;
    local_268._40_8_ = 1.0;
    local_268._64_8_ = 0.0;
    local_268._72_8_ = 0.0;
    local_268._48_8_ = 0.0;
    local_268._56_8_ = 0.0;
    local_268._80_8_ = 1.0;
    dStack_1f8 = 0.0;
    local_268._88_8_ = 0.0;
    local_268._96_16_ = ZEXT816(0);
    local_1f0 = 1.0;
    Identity((matrix4d *)local_268);
    puVar21 = &switchD_002dd33e::switchdataD_004919b0;
    uVar39 = d_1._0_8_;
    switch(x.op_type) {
    case Transform:
      XformOp::get_value<tinyusdz::value::matrix4f>
                ((optional<tinyusdz::value::matrix4f> *)&eval,&x,t,tinterp);
      d_1.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
      if ((bool)eval.err._M_dataplus._M_p._0_1_ == true) {
        d_1._6_2_ = eval.err._M_dataplus._M_p._6_2_;
        d_1._4_2_ = eval.err._M_dataplus._M_p._4_2_;
        d_1.contained._28_4_ = eval.m.m[0][0]._4_4_;
        d_1.contained._12_4_ = eval.err.field_2._M_allocated_capacity._4_4_;
        d_1.contained._16_4_ = eval.err.field_2._8_4_;
        d_1.contained._20_4_ = eval.err.field_2._12_4_;
        d_1.contained._24_4_ = eval.m.m[0][0]._0_4_;
        d_1.contained._0_4_ =
             (undefined4)
             (CONCAT26(eval.err._M_string_length._2_2_,
                       CONCAT24((undefined2)eval.err._M_string_length,d_1._4_4_)) >> 0x20);
        d_1.contained._4_4_ = eval.err._M_string_length._4_4_;
        d_1.contained._8_4_ = eval.err.field_2._M_allocated_capacity._0_4_;
        pvVar14 = nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::value
                            ((optional<tinyusdz::value::matrix4f> *)&d_1);
        uVar39 = *(undefined8 *)pvVar14->m[0];
        uVar3 = *(undefined8 *)(pvVar14->m[0] + 2);
        afVar38 = pvVar14->m[1];
        in_XMM2 = pvVar14->m[2];
        uVar4 = *(undefined8 *)pvVar14->m[3];
        uVar5 = *(undefined8 *)(pvVar14->m[3] + 2);
        eval.err._M_dataplus._M_p._0_1_ = (undefined1)uVar39;
        eval.err._M_dataplus._M_p._1_1_ = (undefined1)((ulong)uVar39 >> 8);
        eval.err._M_dataplus._M_p._2_2_ = SUB82((ulong)uVar39 >> 0x10,0);
        eval.err._M_dataplus._M_p._4_2_ = (undefined2)((ulong)uVar39 >> 0x20);
        eval.err._M_dataplus._M_p._6_2_ = (undefined2)((ulong)uVar39 >> 0x30);
        eval.err._M_string_length._0_2_ = (undefined2)uVar3;
        eval.err._M_string_length._2_2_ = (undefined2)((ulong)uVar3 >> 0x10);
        eval.err._M_string_length._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
        eval.err.field_2._M_allocated_capacity._0_4_ = afVar38[0];
        eval.err.field_2._M_allocated_capacity._4_4_ = afVar38[1];
        eval.err.field_2._8_4_ = afVar38[2];
        eval.err.field_2._12_4_ = afVar38[3];
        eval.m.m[0][0]._0_4_ = in_XMM2[0];
        eval.m.m[0][0]._4_4_ = in_XMM2[1];
        eval.m.m[0][1]._0_4_ = in_XMM2[2];
        eval.m.m[0][1]._4_4_ = in_XMM2[3];
        eval.m.m[0][2]._0_4_ = (undefined4)uVar4;
        eval.m.m[0][2]._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
        eval.m.m[0][3]._0_4_ = (undefined4)uVar5;
        eval.m.m[0][3]._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
        oVar24 = (optional<float>)local_268;
        pXVar15 = &eval;
        for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
          for (lVar26 = 0; lVar26 != 4; lVar26 = lVar26 + 1) {
            *(double *)((long)oVar24 + lVar26 * 8) =
                 (double)*(float *)((long)((pXVar15->m).m + -1) + lVar26 * 4);
          }
          oVar24 = (optional<float>)((long)oVar24 + 0x20);
          pXVar15 = (XformEvaluator *)&(pXVar15->err).field_2;
        }
LAB_002ddcfd:
        uVar39._4_4_ = d_1._4_4_;
        uVar39._0_1_ = d_1.has_value_;
        uVar39._1_3_ = d_1._1_3_;
        if (x.inverted == false) goto switchD_002dd33e_default;
        dVar2 = determinant((matrix4d *)local_268);
        uVar39._4_4_ = d_1._4_4_;
        uVar39._0_1_ = d_1.has_value_;
        uVar39._1_3_ = d_1._1_3_;
        if (1e-09 <= ABS(dVar2)) {
          inverse((matrix4d *)&eval,(matrix4d *)local_268);
          goto LAB_002de673;
        }
        if (err != (string *)0x0) {
          if (x.suffix._M_string_length == 0) goto LAB_002de6bd;
          ::std::__cxx11::string::string
                    ((string *)&ret,
                     "`xformOp:transform:{}` is singular matrix and cannot be inverted.\n",
                     (allocator *)&d_1);
          fmt::format<std::__cxx11::string>
                    ((string *)&eval,(fmt *)&ret,(string *)&x.suffix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oVar24);
          ::std::__cxx11::string::append((string *)err);
          ::std::__cxx11::string::_M_dispose();
          goto LAB_002de4fc;
        }
      }
      else {
        XformOp::get_value<tinyusdz::value::matrix4d>
                  ((optional<tinyusdz::value::matrix4d> *)&ret,&x,t,tinterp);
        uVar39._4_4_ = d_1._4_4_;
        uVar39._0_1_ = d_1.has_value_;
        uVar39._1_3_ = d_1._1_3_;
        eval.err._M_dataplus._M_p._0_1_ =
             ret.contained.
             super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0._0_1_;
        if (ret.contained.
            super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0._0_1_ != '\0') {
          oVar24.has_value_ = true;
          oVar24._1_3_ = 0;
          oVar24.contained = (storage_t<float>)0x0;
          psVar27 = &ret.contained.
                     super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0.m_error._M_string_length;
          psVar30 = &eval.err._M_string_length;
          for (oVar23 = oVar24; oVar23 != (optional<float>)0x0;
              oVar23 = (optional<float>)((long)oVar23 + -1)) {
            *psVar30 = *psVar27;
            psVar27 = psVar27 + (ulong)bVar34 * -2 + 1;
            psVar30 = psVar30 + (ulong)bVar34 * -2 + 1;
          }
          pvVar18 = nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::value
                              ((optional<tinyusdz::value::matrix4d> *)&eval);
          pdVar31 = (double *)local_268;
          for (; oVar24 != (optional<float>)0x0; oVar24 = (optional<float>)((long)oVar24 + -1)) {
            *pdVar31 = pvVar18->m[0][0];
            pvVar18 = (value_type *)((long)pvVar18 + ((ulong)bVar34 * -2 + 1) * 8);
            pdVar31 = pdVar31 + (ulong)bVar34 * -2 + 1;
          }
          goto LAB_002ddcfd;
        }
joined_r0x002de54e:
        if (err != (string *)0x0) goto LAB_002de6bd;
      }
      break;
    case Translate:
      XformOp::get_value<std::array<tinyusdz::value::half,3ul>>
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&eval,&x,t,tinterp);
      f_2.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
      oVar23 = f_2;
      if ((bool)eval.err._M_dataplus._M_p._0_1_ == true) {
        oVar24 = (optional<float>)&local_3a8;
        f_2.contained._0_2_ = eval.err._M_dataplus._M_p._4_2_;
        f_2._2_2_ = eval.err._M_dataplus._M_p._2_2_;
        f_2._0_2_ = oVar23._0_2_;
        f_2.contained._2_2_ = eval.err._M_dataplus._M_p._6_2_;
        pvVar11 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                            ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&f_2);
        fVar35 = tinyusdz::value::half_to_float((half)pvVar11->_M_elems[0].value);
        pvVar11 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                            ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&f_2);
        fVar36 = tinyusdz::value::half_to_float((half)pvVar11->_M_elems[1].value);
        local_3e8._8_4_ = SUB84((double)fVar36,0);
        local_3e8._0_8_ = (double)fVar35;
        local_3e8._12_4_ = (int)((ulong)(double)fVar36 >> 0x20);
        pvVar11 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                            ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&f_2);
        fVar35 = tinyusdz::value::half_to_float((half)pvVar11->_M_elems[2].value);
        dStack_1f8 = (double)fVar35;
        uVar39 = d_1._0_8_;
      }
      else {
        XformOp::get_value<std::array<float,3ul>>
                  ((optional<std::array<float,_3UL>_> *)&eval,&x,t,tinterp);
        d_1.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
        if ((bool)eval.err._M_dataplus._M_p._0_1_ == true) {
          oVar24 = (optional<float>)((long)&d_1.contained + 8);
          d_1.contained._4_4_ = eval.err._M_string_length._4_4_;
          d_1._6_2_ = eval.err._M_dataplus._M_p._6_2_;
          d_1._4_2_ = eval.err._M_dataplus._M_p._4_2_;
          d_1.contained._0_4_ =
               (undefined4)
               (CONCAT26(eval.err._M_string_length._2_2_,
                         CONCAT24((undefined2)eval.err._M_string_length,d_1._4_4_)) >> 0x20);
          pvVar12 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                              ((optional<std::array<float,_3UL>_> *)&d_1);
          fVar35 = pvVar12->_M_elems[0];
          pvVar12 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                              ((optional<std::array<float,_3UL>_> *)&d_1);
          local_3e8._8_4_ = SUB84((double)pvVar12->_M_elems[1],0);
          local_3e8._0_8_ = (double)fVar35;
          local_3e8._12_4_ = (int)((ulong)(double)pvVar12->_M_elems[1] >> 0x20);
          pvVar12 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                              ((optional<std::array<float,_3UL>_> *)&d_1);
          uVar39._4_4_ = d_1._4_4_;
          uVar39._0_1_ = d_1.has_value_;
          uVar39._1_3_ = d_1._1_3_;
          dStack_1f8 = (double)pvVar12->_M_elems[2];
        }
        else {
          XformOp::get_value<std::array<double,3ul>>
                    ((optional<std::array<double,_3UL>_> *)&ret,&x,t,tinterp);
          uVar39._4_4_ = d_1._4_4_;
          uVar39._0_1_ = d_1.has_value_;
          uVar39._1_3_ = d_1._1_3_;
          eval.err._M_dataplus._M_p._0_1_ =
               ret.contained.
               super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0._0_1_;
          if (ret.contained.
              super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0._0_1_ == '\0') goto joined_r0x002de54e;
          oVar24 = (optional<float>)&eval.err._M_string_length;
          eval.err.field_2._8_4_ =
               SUB84(ret.contained.
                     super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0.m_value.m[0][3],0);
          eval.err.field_2._12_4_ =
               (undefined4)
               ((ulong)ret.contained.
                       super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0._24_8_ >> 0x20);
          eval.err._M_string_length._0_2_ =
               (undefined2)
               ret.contained.
               super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0.m_error._M_string_length;
          eval.err._M_string_length._2_2_ =
               (undefined2)
               ((ulong)ret.contained.
                       super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0._8_8_ >> 0x10);
          eval.err._M_string_length._4_4_ =
               (undefined4)
               ((ulong)ret.contained.
                       super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0._8_8_ >> 0x20);
          eval.err.field_2._M_allocated_capacity._0_4_ =
               SUB84(ret.contained.
                     super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0.m_value.m[0][2],0);
          eval.err.field_2._M_allocated_capacity._4_4_ =
               (undefined4)
               ((ulong)ret.contained.
                       super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0._16_8_ >> 0x20);
          pvVar13 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                              ((optional<std::array<double,_3UL>_> *)&eval);
          local_3e8._0_8_ = pvVar13->_M_elems[0];
          pvVar13 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                              ((optional<std::array<double,_3UL>_> *)&eval);
          local_3e8._8_4_ = SUB84(pvVar13->_M_elems[1],0);
          local_3e8._12_4_ = (int)((ulong)pvVar13->_M_elems[1] >> 0x20);
          pvVar13 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                              ((optional<std::array<double,_3UL>_> *)&eval);
          uVar39._4_4_ = d_1._4_4_;
          uVar39._0_1_ = d_1.has_value_;
          uVar39._1_3_ = d_1._1_3_;
          dStack_1f8 = pvVar13->_M_elems[2];
        }
      }
      if (x.inverted != false) {
        dStack_1f8 = (double)CONCAT44((uint)((ulong)dStack_1f8 >> 0x20) ^ DAT_00483250._4_4_,
                                      SUB84(dStack_1f8,0) ^ (uint)DAT_00483250);
      }
      auVar37._0_4_ = (int)(x._4_4_ << 0x1f) >> 0x1f;
      auVar37._4_4_ = (int)(x._4_4_ << 0x1f) >> 0x1f;
      auVar37._8_4_ = (int)(x._4_4_ << 0x1f) >> 0x1f;
      auVar37._12_4_ = (int)(x._4_4_ << 0x1f) >> 0x1f;
      in_XMM2 = (float  [4])(~auVar37 & local_3e8);
      local_268._96_16_ = (local_3e8 ^ _DAT_00483250) & auVar37 | (undefined1  [16])in_XMM2;
    default:
switchD_002dd33e_default:
      d_1._0_8_ = uVar39;
      tinyusdz::value::Mult<tinyusdz::value::matrix4d,double,4ul>
                ((matrix4d *)&eval,(value *)local_268,&cm,(matrix4d *)oVar24);
      pXVar15 = &eval;
      pmVar29 = &cm;
      for (lVar25 = 0x10; lVar25 != 0; lVar25 = lVar25 + -1) {
        pmVar29->m[0][0] = (double)(pXVar15->err)._M_dataplus._M_p;
        pXVar15 = (XformEvaluator *)((long)pXVar15 + (ulong)bVar34 * -0x10 + 8);
        pmVar29 = (matrix4d *)((long)pmVar29 + ((ulong)bVar34 * -2 + 1) * 8);
      }
      bVar8 = true;
      goto LAB_002de6c5;
    case Scale:
      XformOp::get_value<std::array<tinyusdz::value::half,3ul>>
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&eval,&x,t,tinterp);
      f_2.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
      oVar23 = f_2;
      if ((bool)eval.err._M_dataplus._M_p._0_1_ == true) {
        oVar24 = (optional<float>)&local_3a8;
        f_2.contained._0_2_ = eval.err._M_dataplus._M_p._4_2_;
        f_2._2_2_ = eval.err._M_dataplus._M_p._2_2_;
        f_2._0_2_ = oVar23._0_2_;
        f_2.contained._2_2_ = eval.err._M_dataplus._M_p._6_2_;
        pvVar11 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                            ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&f_2);
        fVar35 = tinyusdz::value::half_to_float((half)pvVar11->_M_elems[0].value);
        local_3e8._0_8_ = (double)fVar35;
        pvVar11 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                            ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&f_2);
        fVar35 = tinyusdz::value::half_to_float((half)pvVar11->_M_elems[1].value);
        local_3c8._0_8_ = (double)fVar35;
        pvVar11 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                            ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&f_2);
        fVar35 = tinyusdz::value::half_to_float((half)pvVar11->_M_elems[2].value);
        local_268._80_8_ = (undefined8)fVar35;
        uVar39 = d_1._0_8_;
      }
      else {
        XformOp::get_value<std::array<float,3ul>>
                  ((optional<std::array<float,_3UL>_> *)&eval,&x,t,tinterp);
        d_1.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
        if ((bool)eval.err._M_dataplus._M_p._0_1_ == true) {
          oVar24 = (optional<float>)((long)&d_1.contained + 8);
          d_1.contained._4_4_ = eval.err._M_string_length._4_4_;
          d_1._6_2_ = eval.err._M_dataplus._M_p._6_2_;
          d_1._4_2_ = eval.err._M_dataplus._M_p._4_2_;
          d_1.contained._0_4_ =
               (undefined4)
               (CONCAT26(eval.err._M_string_length._2_2_,
                         CONCAT24((undefined2)eval.err._M_string_length,d_1._4_4_)) >> 0x20);
          pvVar12 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                              ((optional<std::array<float,_3UL>_> *)&d_1);
          local_3e8._0_8_ = (double)pvVar12->_M_elems[0];
          pvVar12 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                              ((optional<std::array<float,_3UL>_> *)&d_1);
          local_3c8._0_8_ = (double)pvVar12->_M_elems[1];
          pvVar12 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                              ((optional<std::array<float,_3UL>_> *)&d_1);
          uVar39._4_4_ = d_1._4_4_;
          uVar39._0_1_ = d_1.has_value_;
          uVar39._1_3_ = d_1._1_3_;
          local_268._80_8_ = (undefined8)pvVar12->_M_elems[2];
        }
        else {
          XformOp::get_value<std::array<double,3ul>>
                    ((optional<std::array<double,_3UL>_> *)&ret,&x,t,tinterp);
          uVar39._4_4_ = d_1._4_4_;
          uVar39._0_1_ = d_1.has_value_;
          uVar39._1_3_ = d_1._1_3_;
          eval.err._M_dataplus._M_p._0_1_ =
               ret.contained.
               super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0._0_1_;
          if (ret.contained.
              super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0._0_1_ == '\0') goto joined_r0x002de54e;
          oVar24 = (optional<float>)&eval.err._M_string_length;
          eval.err.field_2._8_4_ =
               SUB84(ret.contained.
                     super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0.m_value.m[0][3],0);
          eval.err.field_2._12_4_ =
               (undefined4)
               ((ulong)ret.contained.
                       super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0._24_8_ >> 0x20);
          eval.err._M_string_length._0_2_ =
               (undefined2)
               ret.contained.
               super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0.m_error._M_string_length;
          eval.err._M_string_length._2_2_ =
               (undefined2)
               ((ulong)ret.contained.
                       super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0._8_8_ >> 0x10);
          eval.err._M_string_length._4_4_ =
               (undefined4)
               ((ulong)ret.contained.
                       super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0._8_8_ >> 0x20);
          eval.err.field_2._M_allocated_capacity._0_4_ =
               SUB84(ret.contained.
                     super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0.m_value.m[0][2],0);
          eval.err.field_2._M_allocated_capacity._4_4_ =
               (undefined4)
               ((ulong)ret.contained.
                       super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0._16_8_ >> 0x20);
          pvVar13 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                              ((optional<std::array<double,_3UL>_> *)&eval);
          local_3e8._0_8_ = pvVar13->_M_elems[0];
          pvVar13 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                              ((optional<std::array<double,_3UL>_> *)&eval);
          local_3c8._0_8_ = pvVar13->_M_elems[1];
          pvVar13 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                              ((optional<std::array<double,_3UL>_> *)&eval);
          uVar39._4_4_ = d_1._4_4_;
          uVar39._0_1_ = d_1.has_value_;
          uVar39._1_3_ = d_1._1_3_;
          local_268._80_8_ = pvVar13->_M_elems[2];
        }
      }
      local_268._0_8_ = local_3e8._0_8_;
      local_268._40_8_ = local_3c8._0_8_;
      if (x.inverted != false) {
        local_268._80_8_ = 1.0 / (double)local_268._80_8_;
        local_268._0_8_ = 1.0 / (double)local_3e8._0_8_;
        local_268._40_8_ = 1.0 / (double)local_3c8._0_8_;
      }
      in_XMM2[2] = 0.0;
      in_XMM2[3] = 0.0;
      in_XMM2._0_8_ = local_268._40_8_;
      goto switchD_002dd33e_default;
    case RotateX:
      XformOp::get_value<tinyusdz::value::half>
                ((optional<tinyusdz::value::half> *)&eval,&x,t,tinterp);
      f_1.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
      if (eval.err._M_dataplus._M_p._0_1_ == '\x01') {
        f_1._2_2_ = eval.err._M_dataplus._M_p._2_2_;
        pvVar16 = nonstd::optional_lite::optional<tinyusdz::value::half>::value
                            ((optional<tinyusdz::value::half> *)&f_1);
        fVar35 = tinyusdz::value::half_to_float((half)pvVar16->value);
        local_3e8._0_8_ = (undefined8)fVar35;
LAB_002de1f6:
        anon_unknown_4::XformEvaluator::XformEvaluator(&eval);
        anon_unknown_4::XformEvaluator::RotateX(&eval,(double)local_3e8._0_8_);
        goto LAB_002de3aa;
      }
      XformOp::get_value<float>((optional<float> *)&eval,&x,t,tinterp);
      f_2.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
      oVar24 = f_2;
      if ((bool)eval.err._M_dataplus._M_p._0_1_ == true) {
        f_2.contained._2_2_ = eval.err._M_dataplus._M_p._6_2_;
        f_2.contained._0_2_ = eval.err._M_dataplus._M_p._4_2_;
        f_2._0_4_ = oVar24._0_4_;
        pvVar19 = nonstd::optional_lite::optional<float>::value(&f_2);
        local_3e8._0_8_ = (undefined8)*pvVar19;
        goto LAB_002de1f6;
      }
      XformOp::get_value<double>((optional<double> *)&eval,&x,t,tinterp);
      d_1.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
      if ((bool)eval.err._M_dataplus._M_p._0_1_ != false) {
        d_1.contained._0_4_ =
             CONCAT22(eval.err._M_string_length._2_2_,(undefined2)eval.err._M_string_length);
        d_1.contained._4_4_ = eval.err._M_string_length._4_4_;
        pvVar20 = nonstd::optional_lite::optional<double>::value((optional<double> *)&d_1);
        local_3e8._0_8_ = *pvVar20;
        goto LAB_002de1f6;
      }
      if (err != (string *)0x0) {
        if (x.suffix._M_string_length != 0) {
          pcVar28 = "`xformOp:rotateX:{}` is not half, float or double type.\n";
          goto LAB_002de5eb;
        }
LAB_002de70e:
        ::std::__cxx11::string::append((char *)err);
      }
LAB_002de713:
      bVar8 = false;
      goto LAB_002de6c5;
    case RotateY:
      XformOp::get_value<tinyusdz::value::half>
                ((optional<tinyusdz::value::half> *)&eval,&x,t,tinterp);
      f_1.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
      if (eval.err._M_dataplus._M_p._0_1_ == '\x01') {
        f_1._2_2_ = eval.err._M_dataplus._M_p._2_2_;
        pvVar16 = nonstd::optional_lite::optional<tinyusdz::value::half>::value
                            ((optional<tinyusdz::value::half> *)&f_1);
        fVar35 = tinyusdz::value::half_to_float((half)pvVar16->value);
        local_3e8._0_8_ = (undefined8)fVar35;
      }
      else {
        XformOp::get_value<float>((optional<float> *)&eval,&x,t,tinterp);
        f_2.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
        oVar24 = f_2;
        if ((bool)eval.err._M_dataplus._M_p._0_1_ == true) {
          f_2.contained._2_2_ = eval.err._M_dataplus._M_p._6_2_;
          f_2.contained._0_2_ = eval.err._M_dataplus._M_p._4_2_;
          f_2._0_4_ = oVar24._0_4_;
          pvVar19 = nonstd::optional_lite::optional<float>::value(&f_2);
          local_3e8._0_8_ = (undefined8)*pvVar19;
        }
        else {
          XformOp::get_value<double>((optional<double> *)&eval,&x,t,tinterp);
          d_1.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
          if ((bool)eval.err._M_dataplus._M_p._0_1_ == false) {
            if (err != (string *)0x0) {
              if (x.suffix._M_string_length == 0) goto LAB_002de70e;
              pcVar28 = "`xformOp:rotateY:{}` is not half, float or double type.\n";
LAB_002de5eb:
              ::std::__cxx11::string::string((string *)&ret,pcVar28,(allocator *)&h_1);
              fmt::format<std::__cxx11::string>
                        ((string *)&eval,(fmt *)&ret,(string *)&x.suffix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         puVar21);
              ::std::__cxx11::string::append((string *)err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            goto LAB_002de713;
          }
          d_1.contained._0_4_ =
               CONCAT22(eval.err._M_string_length._2_2_,(undefined2)eval.err._M_string_length);
          d_1.contained._4_4_ = eval.err._M_string_length._4_4_;
          pvVar20 = nonstd::optional_lite::optional<double>::value((optional<double> *)&d_1);
          local_3e8._0_8_ = *pvVar20;
        }
      }
      anon_unknown_4::XformEvaluator::XformEvaluator(&eval);
      anon_unknown_4::XformEvaluator::RotateY(&eval,(double)local_3e8._0_8_);
      goto LAB_002de3aa;
    case RotateZ:
      XformOp::get_value<tinyusdz::value::half>
                ((optional<tinyusdz::value::half> *)&eval,&x,t,tinterp);
      f_1.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
      if (eval.err._M_dataplus._M_p._0_1_ == '\x01') {
        f_1._2_2_ = eval.err._M_dataplus._M_p._2_2_;
        pvVar16 = nonstd::optional_lite::optional<tinyusdz::value::half>::value
                            ((optional<tinyusdz::value::half> *)&f_1);
        fVar35 = tinyusdz::value::half_to_float((half)pvVar16->value);
        local_3e8._0_8_ = (undefined8)fVar35;
      }
      else {
        XformOp::get_value<float>((optional<float> *)&eval,&x,t,tinterp);
        f_2.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
        oVar24 = f_2;
        if ((bool)eval.err._M_dataplus._M_p._0_1_ == true) {
          f_2.contained._2_2_ = eval.err._M_dataplus._M_p._6_2_;
          f_2.contained._0_2_ = eval.err._M_dataplus._M_p._4_2_;
          f_2._0_4_ = oVar24._0_4_;
          pvVar19 = nonstd::optional_lite::optional<float>::value(&f_2);
          local_3e8._0_8_ = (undefined8)*pvVar19;
        }
        else {
          XformOp::get_value<double>((optional<double> *)&eval,&x,t,tinterp);
          d_1.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
          if ((bool)eval.err._M_dataplus._M_p._0_1_ == false) {
            if (err != (string *)0x0) {
              if (x.suffix._M_string_length == 0) goto LAB_002de70e;
              pcVar28 = "`xformOp:rotateZ:{}` is not half, float or double type.\n";
              goto LAB_002de5eb;
            }
            goto LAB_002de713;
          }
          d_1.contained._0_4_ =
               CONCAT22(eval.err._M_string_length._2_2_,(undefined2)eval.err._M_string_length);
          d_1.contained._4_4_ = eval.err._M_string_length._4_4_;
          pvVar20 = nonstd::optional_lite::optional<double>::value((optional<double> *)&d_1);
          local_3e8._0_8_ = *pvVar20;
        }
      }
      anon_unknown_4::XformEvaluator::XformEvaluator(&eval);
      anon_unknown_4::XformEvaluator::RotateZ(&eval,(double)local_3e8._0_8_);
LAB_002de3aa:
      (anonymous_namespace)::XformEvaluator::result_abi_cxx11_(&ret,&eval);
      cVar6 = ret.contained.
              super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value;
      if (ret.contained.
          super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar17 = nonstd::expected_lite::
                  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&ret);
        pdVar31 = (double *)local_268;
        for (lVar25 = 0x10; lVar25 != 0; lVar25 = lVar25 + -1) {
          *pdVar31 = pvVar17->m[0][0];
          pvVar17 = (value_type *)((long)pvVar17 + ((ulong)bVar34 * -2 + 1) * 8);
          pdVar31 = pdVar31 + (ulong)bVar34 * -2 + 1;
        }
        puVar21._0_1_ = false;
        puVar21._1_3_ = 0;
        puVar21._4_4_ = (storage_t<float>)0x0;
      }
      else if (err != (string *)0x0) {
        nonstd::expected_lite::
        expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        ::std::__cxx11::string::append((string *)err);
      }
      nonstd::expected_lite::
      expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
      ::std::__cxx11::string::_M_dispose();
      oVar24 = (optional<float>)puVar21;
      uVar39 = d_1._0_8_;
joined_r0x002ddaff:
      if (cVar6 != '\0') goto switchD_002dd33e_default;
      break;
    case RotateXYZ:
    case RotateXZY:
    case RotateYXZ:
    case RotateYZX:
    case RotateZXY:
    case RotateZYX:
      XformOp::get_value<std::array<tinyusdz::value::half,3ul>>
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&eval,&x,t,tinterp);
      uVar39 = in_XMM2._8_8_;
      h.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
      if (eval.err._M_dataplus._M_p._0_1_ != '\x01') {
        XformOp::get_value<std::array<float,3ul>>
                  ((optional<std::array<float,_3UL>_> *)&eval,&x,t,tinterp);
        uVar39 = in_XMM2._8_8_;
        f.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
        if (eval.err._M_dataplus._M_p._0_1_ == '\x01') {
          oVar24 = (optional<float>)&eval.err._M_string_length;
          f.contained._8_4_ = eval.err._M_string_length._4_4_;
          f.contained._0_8_ =
               CONCAT26(eval.err._M_string_length._2_2_,
                        CONCAT24((undefined2)eval.err._M_string_length,
                                 CONCAT22(eval.err._M_dataplus._M_p._6_2_,
                                          eval.err._M_dataplus._M_p._4_2_)));
          pvVar12 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value(&f);
          local_3e8._8_4_ = extraout_XMM0_Dc_01;
          local_3e8._0_8_ = (double)pvVar12->_M_elems[0];
          local_3e8._12_4_ = extraout_XMM0_Dd_01;
          pvVar12 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value(&f);
          local_3c8._8_4_ = extraout_XMM0_Dc_02;
          local_3c8._0_8_ = (double)pvVar12->_M_elems[1];
          local_3c8._12_4_ = extraout_XMM0_Dd_02;
          pvVar12 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value(&f);
          afVar38._0_8_ = (double)pvVar12->_M_elems[2];
          afVar38[2] = (float)(int)uVar39;
          afVar38[3] = (float)(int)((ulong)uVar39 >> 0x20);
          goto LAB_002dd4ca;
        }
        XformOp::get_value<std::array<double,3ul>>
                  ((optional<std::array<double,_3UL>_> *)&ret,&x,t,tinterp);
        eval.err._M_dataplus._M_p._0_1_ =
             ret.contained.
             super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0._0_1_;
        if (ret.contained.
            super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0._0_1_ != '\0') {
          oVar24 = (optional<float>)&eval.err._M_string_length;
          eval.err.field_2._8_4_ =
               SUB84(ret.contained.
                     super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0.m_value.m[0][3],0);
          eval.err.field_2._12_4_ =
               (undefined4)
               ((ulong)ret.contained.
                       super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0._24_8_ >> 0x20);
          eval.err._M_string_length._0_2_ =
               (undefined2)
               ret.contained.
               super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0.m_error._M_string_length;
          eval.err._M_string_length._2_2_ =
               (undefined2)
               ((ulong)ret.contained.
                       super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0._8_8_ >> 0x10);
          eval.err._M_string_length._4_4_ =
               (undefined4)
               ((ulong)ret.contained.
                       super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0._8_8_ >> 0x20);
          eval.err.field_2._M_allocated_capacity._0_4_ =
               SUB84(ret.contained.
                     super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0.m_value.m[0][2],0);
          eval.err.field_2._M_allocated_capacity._4_4_ =
               (undefined4)
               ((ulong)ret.contained.
                       super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0._16_8_ >> 0x20);
          pvVar13 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                              ((optional<std::array<double,_3UL>_> *)&eval);
          local_3e8._8_8_ = 0;
          local_3e8._0_8_ = pvVar13->_M_elems[0];
          local_3c8._8_8_ = 0;
          local_3c8._0_8_ = pvVar13->_M_elems[1];
          afVar38[2] = 0.0;
          afVar38[3] = 0.0;
          afVar38._0_8_ = pvVar13->_M_elems[2];
          goto LAB_002dd4ca;
        }
        if (x.suffix._M_string_length == 0) {
          ::std::__cxx11::string::string
                    ((string *)&f_1,"`{}` is not half3, float3 or double3 type.\n",&local_3c9);
          tinyusdz::to_string_abi_cxx11_((string *)&h_1,(tinyusdz *)&x,op_00);
          fmt::format<std::__cxx11::string>
                    ((string *)&f_2,(fmt *)&f_1,(string *)&h_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar21);
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&f_1,"`{}:{}` is not half3, float3 or double3 type.\n",&local_3c9);
          tinyusdz::to_string_abi_cxx11_((string *)&h_1,(tinyusdz *)&x,op);
          fmt::format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)&f_2,(fmt *)&f_1,(string *)&h_1,&x.suffix,args_1);
        }
        oVar24 = (optional<float>)((long)&d_1.contained + 8);
        if (f_2 == (optional<float>)&local_3a8) {
          d_1.contained._8_4_ =
               (undefined4)CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0])
          ;
          d_1.contained._16_4_ = (undefined4)local_3a8._8_8_;
          d_1.contained._20_4_ = (undefined4)((ulong)local_3a8._8_8_ >> 0x20);
          d_1._0_8_ = oVar24;
        }
        else {
          d_1.contained._8_4_ =
               (undefined4)CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0])
          ;
          d_1._0_8_ = f_2;
        }
        d_1.contained._12_4_ = (undefined4)((uint7)local_3a8._1_7_ >> 0x18);
        d_1.contained._0_4_ = (undefined4)local_3b0;
        d_1.contained._4_4_ = (undefined4)(local_3b0 >> 0x20);
        local_3b0 = 0;
        local_3a8._M_local_buf[0] = '\0';
        f_2 = (optional<float>)&local_3a8;
        nonstd::expected_lite::
        expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&ret,(unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&d_1);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        goto LAB_002ddaab;
      }
      oVar24 = (optional<float>)&eval.err._M_string_length;
      h.contained._4_2_ = eval.err._M_dataplus._M_p._6_2_;
      h.contained._0_4_ = CONCAT22(eval.err._M_dataplus._M_p._4_2_,eval.err._M_dataplus._M_p._2_2_);
      pvVar11 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value(&h);
      fVar35 = tinyusdz::value::half_to_float((half)pvVar11->_M_elems[0].value);
      local_3e8._8_4_ = extraout_XMM0_Dc;
      local_3e8._0_8_ = (double)fVar35;
      local_3e8._12_4_ = extraout_XMM0_Dd;
      pvVar11 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value(&h);
      fVar35 = tinyusdz::value::half_to_float((half)pvVar11->_M_elems[1].value);
      local_3c8._8_4_ = extraout_XMM0_Dc_00;
      local_3c8._0_8_ = (double)fVar35;
      local_3c8._12_4_ = extraout_XMM0_Dd_00;
      pvVar11 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value(&h);
      fVar35 = tinyusdz::value::half_to_float((half)pvVar11->_M_elems[2].value);
      afVar38._0_8_ = (double)fVar35;
      afVar38[2] = (float)(int)uVar39;
      afVar38[3] = (float)(int)((ulong)uVar39 >> 0x20);
LAB_002dd4ca:
      in_XMM2 = afVar38;
      if (x.inverted != false) {
        local_3e8._0_8_ = local_3e8._0_8_ ^ 0x8000000000000000;
        local_3e8._12_4_ = local_3e8._12_4_ ^ 0x80000000;
        local_3c8._0_8_ = local_3c8._0_8_ ^ 0x8000000000000000;
        local_3c8._12_4_ = local_3c8._12_4_ ^ 0x80000000;
        in_XMM2._0_8_ = afVar38._0_8_ ^ 0x8000000000000000;
        in_XMM2[2] = afVar38[2];
        in_XMM2[3] = -afVar38[3];
      }
      local_398 = in_XMM2;
      anon_unknown_4::XformEvaluator::XformEvaluator(&eval);
      if (x.inverted != true) {
        puVar21 = &switchD_002dd55c::switchdataD_004919e8;
        switch(x.op_type) {
        case RotateXYZ:
          goto switchD_002dd540_caseD_b;
        case RotateXZY:
          goto switchD_002dd540_caseD_9;
        case RotateYXZ:
          goto switchD_002dd540_caseD_a;
        case RotateYZX:
          goto switchD_002dd540_caseD_7;
        case RotateZXY:
          goto switchD_002dd540_caseD_8;
        case RotateZYX:
          goto switchD_002dd540_caseD_6;
        default:
          goto switchD_002dd540_default;
        }
      }
      puVar21 = &switchD_002dd540::switchdataD_00491a00;
      switch(x.op_type) {
      case RotateXYZ:
        goto switchD_002dd540_caseD_6;
      case RotateXZY:
switchD_002dd540_caseD_7:
        anon_unknown_4::XformEvaluator::RotateY(&eval,(double)local_3c8._0_8_);
        anon_unknown_4::XformEvaluator::RotateZ(&eval,(double)local_398._0_8_);
        oVar24 = (optional<float>)puVar21;
        goto LAB_002dda90;
      case RotateYXZ:
switchD_002dd540_caseD_8:
        anon_unknown_4::XformEvaluator::RotateZ(&eval,(double)local_398._0_8_);
        anon_unknown_4::XformEvaluator::RotateX(&eval,(double)local_3e8._0_8_);
        oVar24 = (optional<float>)puVar21;
        break;
      case RotateYZX:
switchD_002dd540_caseD_9:
        anon_unknown_4::XformEvaluator::RotateX(&eval,(double)local_3e8._0_8_);
        anon_unknown_4::XformEvaluator::RotateZ(&eval,(double)local_398._0_8_);
        oVar24 = (optional<float>)puVar21;
        break;
      case RotateZXY:
switchD_002dd540_caseD_a:
        anon_unknown_4::XformEvaluator::RotateY(&eval,(double)local_3c8._0_8_);
        anon_unknown_4::XformEvaluator::RotateX(&eval,(double)local_3e8._0_8_);
        oVar24 = (optional<float>)puVar21;
        goto LAB_002dd998;
      case RotateZYX:
switchD_002dd540_caseD_b:
        anon_unknown_4::XformEvaluator::RotateX(&eval,(double)local_3e8._0_8_);
        anon_unknown_4::XformEvaluator::RotateY(&eval,(double)local_3c8._0_8_);
        oVar24 = (optional<float>)puVar21;
LAB_002dd998:
        anon_unknown_4::XformEvaluator::RotateZ(&eval,(double)local_398._0_8_);
        goto LAB_002dda9d;
      default:
switchD_002dd540_default:
        d_1.has_value_ = true;
        d_1._1_3_ = 0x491e;
        d_1._4_4_ = 0;
        nonstd::expected_lite::
        expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<const_char_*,_0>(&ret,(unexpected_type<const_char_*> *)&d_1);
        goto LAB_002ddaab;
      }
      anon_unknown_4::XformEvaluator::RotateY(&eval,(double)local_3c8._0_8_);
LAB_002dda9d:
      (anonymous_namespace)::XformEvaluator::result_abi_cxx11_(&ret,&eval);
LAB_002ddaab:
      ::std::__cxx11::string::_M_dispose();
      cVar6 = ret.contained.
              super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value;
      if (ret.contained.
          super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == false) {
        nonstd::expected_lite::
        expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        ::std::__cxx11::string::append((string *)err);
      }
      else {
        pvVar17 = nonstd::expected_lite::
                  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&ret);
        pdVar31 = (double *)local_268;
        for (lVar25 = 0x10; lVar25 != 0; lVar25 = lVar25 + -1) {
          *pdVar31 = pvVar17->m[0][0];
          pvVar17 = (value_type *)((long)pvVar17 + ((ulong)bVar34 * -2 + 1) * 8);
          pdVar31 = pdVar31 + (ulong)bVar34 * -2 + 1;
        }
        oVar24.has_value_ = false;
        oVar24._1_3_ = 0;
        oVar24.contained = (storage_t<float>)0x0;
      }
      nonstd::expected_lite::
      expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
      uVar39 = d_1._0_8_;
      goto joined_r0x002ddaff;
    case Orient:
      pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x3ff0000000000000;
      ret.contained.
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[0][0] = 1.0;
      ret.contained.
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[0][3] = 0.0;
      ret.contained.
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[0][1] = 0.0;
      ret.contained.
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[0][2] = 0.0;
      ret.contained.
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[1][0] = 1.0;
      ret.contained.
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[1][1] = 0.0;
      ret.contained.
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[1][2] = 0.0;
      ret.contained.
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[1][3] = 0.0;
      ret.contained.
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[2][0] = 1.0;
      XformOp::get_value<tinyusdz::value::quath>
                ((optional<tinyusdz::value::quath> *)&eval,&x,t,tinterp);
      h_1.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
      if (eval.err._M_dataplus._M_p._0_1_ == '\x01') {
        h_1.contained._2_2_ = eval.err._M_dataplus._M_p._4_2_;
        h_1.contained.data.__align =
             (anon_struct_2_0_00000001_for___align)eval.err._M_dataplus._M_p._2_2_;
        h_1.contained._4_2_ = eval.err._M_dataplus._M_p._6_2_;
        h_1.contained._6_2_ = (undefined2)eval.err._M_string_length;
        q = nonstd::optional_lite::optional<tinyusdz::value::quath>::value(&h_1);
        to_matrix3x3((matrix3d *)&ret,q);
LAB_002ddf6c:
        if (x.inverted == true) {
          pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    0x3ff0000000000000;
          eval.err._M_dataplus._M_p._0_1_ = '\0';
          eval.err._M_dataplus._M_p._1_1_ = 0;
          eval.err._M_dataplus._M_p._2_2_ = 0;
          eval.err._M_dataplus._M_p._4_2_ = 0;
          eval.err._M_dataplus._M_p._6_2_ = 0x3ff0;
          eval.err.field_2._8_4_ = 0;
          eval.err.field_2._12_4_ = 0;
          eval.err._M_string_length._0_2_ = 0;
          eval.err._M_string_length._2_2_ = 0;
          eval.err._M_string_length._4_4_ = 0;
          eval.err.field_2._M_allocated_capacity._0_4_ = 0;
          eval.err.field_2._M_allocated_capacity._4_4_ = 0;
          eval.m.m[0][0]._0_4_ = 0.0;
          eval.m.m[0][0]._4_4_ = 1.875;
          eval.m.m[0][1]._0_4_ = 0.0;
          eval.m.m[0][1]._4_4_ = 0.0;
          eval.m.m[0][2]._0_4_ = 0;
          eval.m.m[0][2]._4_4_ = 0;
          eval.m.m[0][3]._0_4_ = 0;
          eval.m.m[0][3]._4_4_ = 0;
          eval.m.m[1][0]._0_4_ = 0;
          eval.m.m[1][0]._4_4_ = 0x3ff00000;
          bVar8 = inverse((matrix3d *)&ret,(matrix3d *)&eval,0.0);
          if ((err != (string *)0x0) && (!bVar8)) {
            if (x.suffix._M_string_length == 0) {
              ::std::__cxx11::string::append((char *)err);
            }
            else {
              ::std::__cxx11::string::string
                        ((string *)&f_2,"`xformOp:orient:{}` is singular and cannot be inverted.\n",
                         (allocator *)&f_1);
              fmt::format<std::__cxx11::string>
                        ((string *)&d_1,(fmt *)&f_2,(string *)&x.suffix,pbVar22);
              ::std::__cxx11::string::append((string *)err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
          }
          pXVar15 = &eval;
          peVar32 = &ret;
          for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
            (peVar32->contained).
            super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_value.m[0][0] = (double)(pXVar15->err)._M_dataplus._M_p;
            pXVar15 = (XformEvaluator *)((long)pXVar15 + (ulong)bVar34 * -0x10 + 8);
            peVar32 = (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)peVar32 + (ulong)bVar34 * -0x10 + 8);
          }
        }
        d_1.has_value_ = false;
        d_1._1_3_ = 0;
        d_1._4_4_ = 0;
        d_1.contained._0_4_ = 0;
        d_1.contained._4_4_ = 0;
        d_1.contained._8_4_ = 0;
        d_1.contained._12_4_ = 0;
        to_matrix((matrix4d *)&eval,(matrix3d *)&ret,(double3 *)&d_1);
LAB_002de673:
        uVar39._4_4_ = d_1._4_4_;
        uVar39._0_1_ = d_1.has_value_;
        uVar39._1_3_ = d_1._1_3_;
        oVar24.has_value_ = true;
        oVar24._1_3_ = 0;
        oVar24.contained = (storage_t<float>)0x0;
        pXVar15 = &eval;
        puVar33 = (undefined8 *)local_268;
        for (; oVar24 != (optional<float>)0x0; oVar24 = (optional<float>)((long)oVar24 + -1)) {
          *puVar33 = (pXVar15->err)._M_dataplus._M_p;
          pXVar15 = (XformEvaluator *)((long)pXVar15 + (ulong)bVar34 * -0x10 + 8);
          puVar33 = puVar33 + (ulong)bVar34 * -2 + 1;
        }
        goto switchD_002dd33e_default;
      }
      XformOp::get_value<tinyusdz::value::quatf>
                ((optional<tinyusdz::value::quatf> *)&eval,&x,t,tinterp);
      f_1.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
      if (eval.err._M_dataplus._M_p._0_1_ == '\x01') {
        f_1.contained._0_8_ =
             CONCAT26(eval.err._M_string_length._2_2_,
                      CONCAT24((undefined2)eval.err._M_string_length,
                               CONCAT22(eval.err._M_dataplus._M_p._6_2_,
                                        eval.err._M_dataplus._M_p._4_2_)));
        f_1.contained._8_8_ =
             CONCAT44(eval.err.field_2._M_allocated_capacity._0_4_,eval.err._M_string_length._4_4_);
        q_00 = nonstd::optional_lite::optional<tinyusdz::value::quatf>::value(&f_1);
        to_matrix3x3((matrix3d *)&eval,q_00);
LAB_002ddf58:
        pXVar15 = &eval;
        peVar32 = &ret;
        for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
          (peVar32->contained).
          super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_value.m[0][0] = (double)(pXVar15->err)._M_dataplus._M_p;
          pXVar15 = (XformEvaluator *)((long)pXVar15 + (ulong)bVar34 * -0x10 + 8);
          peVar32 = (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)peVar32 + (ulong)bVar34 * -0x10 + 8);
        }
        goto LAB_002ddf6c;
      }
      XformOp::get_value<tinyusdz::value::quatd>
                ((optional<tinyusdz::value::quatd> *)&eval,&x,t,tinterp);
      d_1.has_value_ = (bool)eval.err._M_dataplus._M_p._0_1_;
      uVar39._4_4_ = d_1._4_4_;
      uVar39._0_1_ = (bool)eval.err._M_dataplus._M_p._0_1_;
      uVar39._1_3_ = d_1._1_3_;
      if ((bool)eval.err._M_dataplus._M_p._0_1_ != false) {
        d_1.contained._0_4_ =
             CONCAT22(eval.err._M_string_length._2_2_,(undefined2)eval.err._M_string_length);
        d_1.contained._16_4_ = eval.err.field_2._8_4_;
        d_1.contained._20_4_ = eval.err.field_2._12_4_;
        d_1.contained._24_4_ = eval.m.m[0][0]._0_4_;
        d_1.contained._28_4_ = eval.m.m[0][0]._4_4_;
        d_1.contained._4_4_ = eval.err._M_string_length._4_4_;
        d_1.contained._8_4_ = eval.err.field_2._M_allocated_capacity._0_4_;
        d_1.contained._12_4_ = eval.err.field_2._M_allocated_capacity._4_4_;
        q_01 = nonstd::optional_lite::optional<tinyusdz::value::quatd>::value(&d_1);
        to_matrix3x3((matrix3d *)&eval,q_01);
        goto LAB_002ddf58;
      }
      if (err == (string *)0x0) break;
      if (x.suffix._M_string_length == 0) goto LAB_002de6bd;
      ::std::__cxx11::string::string
                ((string *)&f_2,"`xformOp:orient:{}` is not quath, quatf or quatd type.\n",
                 (allocator *)&f);
      fmt::format<std::__cxx11::string>((string *)&eval,(fmt *)&f_2,(string *)&x.suffix,pbVar22);
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
LAB_002de4fc:
      ::std::__cxx11::string::_M_dispose();
      uVar39._4_4_ = d_1._4_4_;
      uVar39._0_1_ = d_1.has_value_;
      uVar39._1_3_ = d_1._1_3_;
      break;
    case ResetXformStack:
      if (uVar9 == 0) {
        oVar24 = (optional<float>)puVar21;
        if (resetXformStack != (bool *)0x0) {
          *resetXformStack = true;
        }
        goto switchD_002dd33e_default;
      }
      if (err == (string *)0x0) break;
LAB_002de6bd:
      d_1._0_8_ = uVar39;
      ::std::__cxx11::string::append((char *)err);
      uVar39 = d_1._0_8_;
    }
    d_1._0_8_ = uVar39;
    bVar8 = false;
LAB_002de6c5:
    XformOp::~XformOp(&x);
    uVar7 = uVar9 + 1;
    if (!bVar8) goto LAB_002de736;
  }
  pmVar29 = &cm;
  for (lVar25 = 0x10; lVar25 != 0; lVar25 = lVar25 + -1) {
    out_matrix->m[0][0] = pmVar29->m[0][0];
    pmVar29 = (matrix4d *)((long)pmVar29 + ((ulong)bVar34 * -2 + 1) * 8);
    out_matrix = (matrix4d *)((long)out_matrix + ((ulong)bVar34 * -2 + 1) * 8);
  }
LAB_002de736:
  return uVar10 <= uVar9;
switchD_002dd540_caseD_6:
  anon_unknown_4::XformEvaluator::RotateZ(&eval,(double)local_398._0_8_);
  anon_unknown_4::XformEvaluator::RotateY(&eval,(double)local_3c8._0_8_);
  oVar24 = (optional<float>)puVar21;
LAB_002dda90:
  anon_unknown_4::XformEvaluator::RotateX(&eval,(double)local_3e8._0_8_);
  goto LAB_002dda9d;
}

Assistant:

bool Xformable::EvaluateXformOps(double t,
                                 value::TimeSampleInterpolationType tinterp,
                                 value::matrix4d *out_matrix,
                                 bool *resetXformStack,
                                 std::string *err) const {
  const auto RotateABC =
      [t, tinterp](const XformOp &x) -> nonstd::expected<value::matrix4d, std::string> {
    value::double3 v;
    if (auto h = x.get_value<value::half3>(t, tinterp)) {
      v[0] = double(half_to_float(h.value()[0]));
      v[1] = double(half_to_float(h.value()[1]));
      v[2] = double(half_to_float(h.value()[2]));
    } else if (auto f = x.get_value<value::float3>(t, tinterp)) {
      v[0] = double(f.value()[0]);
      v[1] = double(f.value()[1]);
      v[2] = double(f.value()[2]);
    } else if (auto d = x.get_value<value::double3>(t, tinterp)) {
      v = d.value();
    } else {
      if (x.suffix.empty()) {
        return nonstd::make_unexpected(
            fmt::format("`{}` is not half3, float3 or double3 type.\n",
                        to_string(x.op_type)));
      } else {
        return nonstd::make_unexpected(
            fmt::format("`{}:{}` is not half3, float3 or double3 type.\n",
                        to_string(x.op_type), x.suffix));
      }
    }

    // invert input, and compute concatenated matrix
    // inv(ABC) = inv(A) x inv(B) x inv(C)
    // as done in pxrUSD.

    if (x.inverted) {
      v[0] = -v[0];
      v[1] = -v[1];
      v[2] = -v[2];
    }

    double xAngle = v[0];
    double yAngle = v[1];
    double zAngle = v[2];

    XformEvaluator eval;

    DCOUT("angles = " << xAngle << ", " << yAngle << ", " << zAngle);
    if (x.inverted) {
      DCOUT("!inverted!\n");
      if (x.op_type == XformOp::OpType::RotateXYZ) {
        // TODO: Apply defined switch for all Rotate*** op.
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateXZY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYXZ) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYZX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZYX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZXY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
#endif
      } else {
        /// ???
        return nonstd::make_unexpected("[InternalError] RotateABC");
      }
    } else {
      if (x.op_type == XformOp::OpType::RotateXYZ) {

#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateXZY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYXZ) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYZX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZYX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZXY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
#endif
      } else {
        /// ???
        return nonstd::make_unexpected("[InternalError] RotateABC");
      }
    }

    return eval.result();
  };

  // Concat matrices
  //
  // Matrix concatenation ordering is its appearance order(right to left)
  // This is same with a notation in math equation: i.e,
  //
  // xformOpOrder = [A, B, C]
  //
  // M = A x B x C
  //
  // p' = A x B x C x p
  //
  // in post-multiply order.
  //
  // But in pre-multiply order system(pxrUSD and TinyUSDZ),
  // C++ code is
  //
  // p' = p x C x B x A
  //
  //
  value::matrix4d cm;
  Identity(&cm);

  for (size_t i = 0; i < xformOps.size(); i++) {
    const auto x = xformOps[i];

    value::matrix4d m;  // local matrix
    Identity(&m);

    switch (x.op_type) {
      case XformOp::OpType::ResetXformStack: {
        if (i != 0) {
          if (err) {
            (*err) +=
                "!resetXformStack! should only appear at the first element of "
                "xformOps\n";
          }
          return false;
        }

        // Notify resetting previous(parent node's) matrices
        if (resetXformStack) {
          (*resetXformStack) = true;
        }
        break;
      }
      case XformOp::OpType::Transform: {
        if (auto sxf = x.get_value<value::matrix4f>(t, tinterp)) {
          value::matrix4f mf = sxf.value();
          for (size_t j = 0; j < 4; j++) {
            for (size_t k = 0; k < 4; k++) {
              m.m[j][k] = double(mf.m[j][k]);
            }
          }
        } else if (auto sxd = x.get_value<value::matrix4d>(t, tinterp)) {
          m = sxd.value();
        } else {
          if (err) {
            (*err) += "`xformOp:transform` is not matrix4f or matrix4d type.\n";
          }
          return false;
        }

        if (x.inverted) {
          // Singular check.
          // pxrUSD uses 1e-9
          double det = determinant(m);

          if (std::fabs(det) < 1e-9) {
            if (err) {
              if (x.suffix.empty()) {
                (*err) +=
                    "`xformOp:transform` is singular matrix and cannot be "
                    "inverted.\n";
              } else {
                (*err) += fmt::format(
                    "`xformOp:transform:{}` is singular matrix and cannot be "
                    "inverted.\n",
                    x.suffix);
              }
            }

            return false;
          }

          m = inverse(m);
        }

        break;
      }
      case XformOp::OpType::Scale: {
        double sx, sy, sz;

        if (auto sxh = x.get_value<value::half3>(t, tinterp)) {
          sx = double(half_to_float(sxh.value()[0]));
          sy = double(half_to_float(sxh.value()[1]));
          sz = double(half_to_float(sxh.value()[2]));
        } else if (auto sxf = x.get_value<value::float3>(t, tinterp)) {
          sx = double(sxf.value()[0]);
          sy = double(sxf.value()[1]);
          sz = double(sxf.value()[2]);
        } else if (auto sxd = x.get_value<value::double3>(t, tinterp)) {
          sx = sxd.value()[0];
          sy = sxd.value()[1];
          sz = sxd.value()[2];
        } else {
          if (err) {
            (*err) += "`xformOp:scale` is not half3, float3 or double3 type.\n";
          }
          return false;
        }

        if (x.inverted) {
          // FIXME: Safe division
          sx = 1.0 / sx;
          sy = 1.0 / sy;
          sz = 1.0 / sz;
        }

        m.m[0][0] = sx;
        m.m[1][1] = sy;
        m.m[2][2] = sz;

        break;
      }
      case XformOp::OpType::Translate: {
        double tx, ty, tz;
        if (auto txh = x.get_value<value::half3>(t, tinterp)) {
          tx = double(half_to_float(txh.value()[0]));
          ty = double(half_to_float(txh.value()[1]));
          tz = double(half_to_float(txh.value()[2]));
        } else if (auto txf = x.get_value<value::float3>(t, tinterp)) {
          tx = double(txf.value()[0]);
          ty = double(txf.value()[1]);
          tz = double(txf.value()[2]);
        } else if (auto txd = x.get_value<value::double3>(t, tinterp)) {
          tx = txd.value()[0];
          ty = txd.value()[1];
          tz = txd.value()[2];
        } else {
          if (err) {
            (*err) +=
                "`xformOp:translate` is not half3, float3 or double3 type.\n";
          }
          return false;
        }

        if (x.inverted) {
          tx = -tx;
          ty = -ty;
          tz = -tz;
        }

        m.m[3][0] = tx;
        m.m[3][1] = ty;
        m.m[3][2] = tz;

        break;
      }
      // FIXME: Validate ROTATE_X, _Y, _Z implementation
      case XformOp::OpType::RotateX: {
        double angle;  // in degrees
        if (auto h = x.get_value<value::half>(t, tinterp)) {
          angle = double(half_to_float(h.value()));
        } else if (auto f = x.get_value<float>(t, tinterp)) {
          angle = double(f.value());
        } else if (auto d = x.get_value<double>(t, tinterp)) {
          angle = d.value();
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) +=
                  "`xformOp:rotateX` is not half, float or double type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:rotateX:{}` is not half, float or double type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        XformEvaluator xe;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        xe.Rotation({1.0, 0.0, 0.0}, angle);
#else
        xe.RotateX(angle);
#endif
        auto ret = xe.result();

        if (ret) {
          m = ret.value();
        } else {
          if (err) {
            (*err) += ret.error();
          }
          return false;
        }
        break;
      }
      case XformOp::OpType::RotateY: {
        double angle;  // in degrees
        if (auto h = x.get_value<value::half>(t, tinterp)) {
          angle = double(half_to_float(h.value()));
        } else if (auto f = x.get_value<float>(t, tinterp)) {
          angle = double(f.value());
        } else if (auto d = x.get_value<double>(t, tinterp)) {
          angle = d.value();
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) +=
                  "`xformOp:rotateY` is not half, float or double type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:rotateY:{}` is not half, float or double type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        XformEvaluator xe;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        xe.Rotation({0.0, 1.0, 0.0}, angle);
#else
        xe.RotateY(angle);
#endif
        auto ret = xe.result();

        if (ret) {
          m = ret.value();
        } else {
          if (err) {
            (*err) += ret.error();
          }
          return false;
        }
        break;
      }
      case XformOp::OpType::RotateZ: {
        double angle;  // in degrees
        if (auto h = x.get_value<value::half>(t, tinterp)) {
          angle = double(half_to_float(h.value()));
        } else if (auto f = x.get_value<float>(t, tinterp)) {
          angle = double(f.value());
        } else if (auto d = x.get_value<double>(t, tinterp)) {
          angle = d.value();
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) +=
                  "`xformOp:rotateZ` is not half, float or double type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:rotateZ:{}` is not half, float or double type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        XformEvaluator xe;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        xe.Rotation({0.0, 0.0, 1.0}, angle);
#else
        xe.RotateZ(angle);
#endif
        auto ret = xe.result();

        if (ret) {
          m = ret.value();
        } else {
          if (err) {
            (*err) += ret.error();
          }
          return false;
        }
        break;
      }
      case XformOp::OpType::Orient: {
        // value::quat stores elements in (x, y, z, w)
        // linalg::quat also stores elements in (x, y, z, w)

        value::matrix3d rm;
        if (auto h = x.get_value<value::quath>(t, tinterp)) {
          rm = to_matrix3x3(h.value());
        } else if (auto f = x.get_value<value::quatf>(t, tinterp)) {
          rm = to_matrix3x3(f.value());
        } else if (auto d = x.get_value<value::quatd>(t, tinterp)) {
          rm = to_matrix3x3(d.value());
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) += "`xformOp:orient` is not quath, quatf or quatd type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:orient:{}` is not quath, quatf or quatd type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        // FIXME: invert before getting matrix.
        if (x.inverted) {
          value::matrix3d inv_rm;
          if (inverse(rm, inv_rm)) {
          } else {
            if (err) {
              if (x.suffix.empty()) {
                (*err) +=
                    "`xformOp:orient` is singular and cannot be inverted.\n";
              } else {
                (*err) += fmt::format(
                    "`xformOp:orient:{}` is singular and cannot be inverted.\n",
                    x.suffix);
              }
            }
          }

          rm = inv_rm;
        }

        m = to_matrix(rm, {0.0, 0.0, 0.0});

        break;
      }

      case XformOp::OpType::RotateXYZ:
      case XformOp::OpType::RotateXZY:
      case XformOp::OpType::RotateYXZ:
      case XformOp::OpType::RotateYZX:
      case XformOp::OpType::RotateZXY:
      case XformOp::OpType::RotateZYX: {
        auto ret = RotateABC(x);

        if (!ret) {
          (*err) += ret.error();
          return false;
        }

        m = ret.value();
      }
    }

    cm = m * cm;  // `m` fist for pre-multiply system.
  }

  (*out_matrix) = cm;

  return true;
}